

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O1

bool __thiscall CsvModelSerialiser::saveModel(CsvModelSerialiser *this,QByteArray *destination)

{
  CsvModelSerialiserPrivate *this_00;
  bool bVar1;
  QTextStream writer;
  QTextStream local_20 [16];
  
  if ((destination == (QByteArray *)0x0) ||
     (this_00 = (CsvModelSerialiserPrivate *)
                (this->super_AbstractSingleRoleSerialiser).super_AbstractStringSerialiser.
                super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
     super_AbstractModelSerialiserPrivate.m_constModel == (QAbstractItemModel *)0x0)) {
    bVar1 = false;
  }
  else {
    QTextStream::QTextStream(local_20,destination,0x12);
    bVar1 = CsvModelSerialiserPrivate::writeCsv(this_00,local_20);
    QTextStream::~QTextStream(local_20);
  }
  return bVar1;
}

Assistant:

bool CsvModelSerialiser::saveModel(QByteArray *destination) const
{
    if (!destination)
        return false;
    Q_D(const CsvModelSerialiser);

    if (!d->m_constModel)
        return false;
    QTextStream writer(destination, QIODevice::WriteOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeCsv(writer);
}